

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

char * rsa_ssh1_fingerprint(RSAKey *key)

{
  BinarySink *pBVar1;
  uint8_t uVar2;
  ssh_hash *h;
  size_t sVar3;
  strbuf *buf_o;
  char *pcVar4;
  ulong local_50;
  size_t i_2;
  size_t i_1;
  ssh_hash *hash;
  int i;
  strbuf *out;
  uchar digest [16];
  RSAKey *key_local;
  
  h = ssh_hash_new(&ssh_md5);
  sVar3 = mp_get_nbits(key->modulus);
  i_2 = sVar3 + 7 >> 3;
  while (i_2 != 0) {
    pBVar1 = h->binarysink_;
    uVar2 = mp_get_byte(key->modulus,i_2 - 1);
    BinarySink_put_byte(pBVar1,uVar2);
    i_2 = i_2 - 1;
  }
  sVar3 = mp_get_nbits(key->exponent);
  local_50 = sVar3 + 7 >> 3;
  while (local_50 != 0) {
    pBVar1 = h->binarysink_;
    uVar2 = mp_get_byte(key->exponent,local_50 - 1);
    BinarySink_put_byte(pBVar1,uVar2);
    local_50 = local_50 - 1;
  }
  ssh_hash_final(h,(uchar *)&out);
  buf_o = strbuf_new();
  sVar3 = mp_get_nbits(key->modulus);
  BinarySink_put_fmt(buf_o->binarysink_,"%zu ",sVar3);
  for (hash._4_4_ = 0; hash._4_4_ < 0x10; hash._4_4_ = hash._4_4_ + 1) {
    pcVar4 = anon_var_dwarf_23ee3 + 10;
    if (hash._4_4_ != 0) {
      pcVar4 = ":";
    }
    BinarySink_put_fmt(buf_o->binarysink_,"%s%02x",pcVar4,(ulong)digest[(long)hash._4_4_ + -8]);
  }
  if (key->comment != (char *)0x0) {
    BinarySink_put_fmt(buf_o->binarysink_," %s",key->comment);
  }
  pcVar4 = strbuf_to_str(buf_o);
  return pcVar4;
}

Assistant:

char *rsa_ssh1_fingerprint(RSAKey *key)
{
    unsigned char digest[16];
    strbuf *out;
    int i;

    /*
     * The hash preimage for SSH-1 key fingerprinting consists of the
     * modulus and exponent _without_ any preceding length field -
     * just the minimum number of bytes to represent each integer,
     * stored big-endian, concatenated with no marker at the division
     * between them.
     */

    ssh_hash *hash = ssh_hash_new(&ssh_md5);
    for (size_t i = (mp_get_nbits(key->modulus) + 7) / 8; i-- > 0 ;)
        put_byte(hash, mp_get_byte(key->modulus, i));
    for (size_t i = (mp_get_nbits(key->exponent) + 7) / 8; i-- > 0 ;)
        put_byte(hash, mp_get_byte(key->exponent, i));
    ssh_hash_final(hash, digest);

    out = strbuf_new();
    put_fmt(out, "%"SIZEu" ", mp_get_nbits(key->modulus));
    for (i = 0; i < 16; i++)
        put_fmt(out, "%s%02x", i ? ":" : "", digest[i]);
    if (key->comment)
        put_fmt(out, " %s", key->comment);
    return strbuf_to_str(out);
}